

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O3

Ptr __thiscall hwnet::ThreadPool::TaskQueue::Get(TaskQueue *this)

{
  pthread_mutex_t *__mutex;
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  int iVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *in_RSI;
  Ptr PVar5;
  
  __mutex = (pthread_mutex_t *)(in_RSI + 8);
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  if (*in_RSI == '\0') {
    do {
      puVar1 = *(undefined8 **)(in_RSI + 0x80);
      if (*(undefined8 **)(in_RSI + 0xa0) != puVar1) {
        uVar2 = *puVar1;
        this->closed = (bool)(char)uVar2;
        *(int3 *)&this->field_0x1 = (int3)((ulong)uVar2 >> 8);
        this->watting = (int)((ulong)uVar2 >> 0x20);
        lVar3 = puVar1[1];
        (this->mtx).super___mutex_base._M_mutex.__align = lVar3;
        if (lVar3 != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
          }
        }
        std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::
        pop_front((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                   *)(in_RSI + 0x70));
        goto LAB_00119c39;
      }
      *(int *)(in_RSI + 4) = *(int *)(in_RSI + 4) + 1;
      std::_V2::condition_variable_any::wait<std::mutex>
                ((condition_variable_any *)(in_RSI + 0x30),(mutex *)&__mutex->__data);
      *(int *)(in_RSI + 4) = *(int *)(in_RSI + 4) + -1;
    } while (*in_RSI == '\0');
  }
  puVar1 = *(undefined8 **)(in_RSI + 0x80);
  if (*(undefined8 **)(in_RSI + 0xa0) == puVar1) {
    this->closed = false;
    *(undefined3 *)&this->field_0x1 = 0;
    this->watting = 0;
    (this->mtx).super___mutex_base._M_mutex.__align = 0;
  }
  else {
    std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::
    pop_front((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_> *
              )(in_RSI + 0x70));
    uVar2 = *puVar1;
    this->closed = (bool)(char)uVar2;
    *(int3 *)&this->field_0x1 = (int3)((ulong)uVar2 >> 8);
    this->watting = (int)((ulong)uVar2 >> 0x20);
    lVar3 = puVar1[1];
    (this->mtx).super___mutex_base._M_mutex.__align = lVar3;
    if (lVar3 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
      }
    }
  }
LAB_00119c39:
  pthread_mutex_unlock(__mutex);
  PVar5.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar5.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Ptr)PVar5.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Task::Ptr ThreadPool::TaskQueue::Get() {
	std::lock_guard<std::mutex> guard(this->mtx);
	for( ; ;) {
		if(this->closed) {
			if(this->tasks.empty()) {
				return nullptr;
			} else {
				Task::Ptr &task = this->tasks.front();
				this->tasks.pop_front();
				return task;
			}
		} else {

			if(this->tasks.empty()) {
				++this->watting;//增加等待数量
				this->cv.wait(this->mtx);
				--this->watting;//减少正在等待的线程数量	
			} else {
				Task::Ptr task = this->tasks.front();
				this->tasks.pop_front();
				return task;
			}	
		}
	}
}